

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

u_char * ngx_cpystrn(u_char *dst,u_char *src,size_t n)

{
  size_t local_28;
  size_t n_local;
  u_char *src_local;
  u_char *dst_local;
  
  local_28 = n;
  n_local = (size_t)src;
  src_local = dst;
  dst_local = dst;
  if (n != 0) {
    while (local_28 = local_28 - 1, local_28 != 0) {
      *src_local = *(u_char *)n_local;
      if (*src_local == '\0') {
        return src_local;
      }
      src_local = src_local + 1;
      n_local = n_local + 1;
    }
    *src_local = '\0';
    dst_local = src_local;
  }
  return dst_local;
}

Assistant:

u_char *
ngx_cpystrn(u_char *dst, u_char *src, size_t n)
{
    if (n == 0) {
        return dst;
    }

    while (--n) {
        *dst = *src;

        if (*dst == '\0') {
            return dst;
        }

        dst++;
        src++;
    }

    *dst = '\0';

    return dst;
}